

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QRect __thiscall
QTableViewPrivate::intersectedRect
          (QTableViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  long lVar1;
  minMaxPair mVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QRect QVar6;
  QRect local_70;
  QRect local_60;
  anon_class_8_1_54a39811 local_50;
  QRect rect_local;
  
  rect_local._8_8_ = rect._8_8_;
  rect_local._0_8_ = rect._0_8_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.q = *(QTableView **)
                &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  mVar2 = intersectedRect::anon_class_8_1_54a39811::operator()
                    (&local_50,this->verticalHeader,topLeft->r,bottomRight->r,
                     (minMaxPair)
                     (rect_local._8_8_ & 0xffffffff00000000 | (ulong)rect_local._0_8_ >> 0x20));
  iVar3 = mVar2.first;
  iVar4 = mVar2.second;
  if (iVar3 == iVar4) {
    QVar6 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    local_60.x1 = rect.x1.m_i;
    local_60.x2 = rect.x2.m_i;
    local_60.y1.m_i = iVar3;
    local_60.y2.m_i = iVar4;
    auVar5 = QRect::operator&(&rect_local,&local_60);
    if ((auVar5._0_4_ + -1 == auVar5._8_4_) && (auVar5._4_4_ + -1 == auVar5._12_4_)) {
      QVar6 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    }
    else {
      mVar2.second = rect_local.x2.m_i;
      mVar2.first = rect_local.x1.m_i;
      mVar2 = intersectedRect::anon_class_8_1_54a39811::operator()
                        (&local_50,this->horizontalHeader,topLeft->c,bottomRight->c,mVar2);
      local_70.x1.m_i = mVar2.first;
      local_70.x2.m_i = mVar2.second;
      local_70.y1.m_i = iVar3;
      local_70.y2.m_i = iVar4;
      QVar6 = (QRect)QRect::operator&(&rect_local,&local_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    Q_Q(const QTableView);

    using minMaxPair = std::pair<int, int>;
    const auto calcMinMax = [q](QHeaderView *hdr, int startIdx, int endIdx, minMaxPair bounds) -> minMaxPair
    {
        minMaxPair ret(std::numeric_limits<int>::max(), std::numeric_limits<int>::min());
        if (hdr->sectionsMoved()) {
            for (int i = startIdx; i <= endIdx; ++i) {
                const int start = hdr->sectionViewportPosition(i);
                const int end = start + hdr->sectionSize(i);
                ret.first = std::min(start, ret.first);
                ret.second = std::max(end, ret.second);
                if (ret.first <= bounds.first && ret.second >= bounds.second)
                    break;
            }
        } else {
            if (q->isRightToLeft() && q->horizontalHeader() == hdr)
                std::swap(startIdx, endIdx);
            ret.first = hdr->sectionViewportPosition(startIdx);
            ret.second = hdr->sectionViewportPosition(endIdx) +
                         hdr->sectionSize(endIdx);
        }
        return ret;
    };

    const auto yVals = calcMinMax(verticalHeader, topLeft.row(), bottomRight.row(),
                                  minMaxPair(rect.top(), rect.bottom()));
    if (yVals.first == yVals.second) // all affected rows are hidden
        return QRect();

    // short circuit: check if no row is inside rect
    const QRect colRect(QPoint(rect.left(), yVals.first),
                        QPoint(rect.right(), yVals.second));
    const QRect intersected = rect.intersected(colRect);
    if (intersected.isNull())
        return QRect();

    const auto xVals = calcMinMax(horizontalHeader, topLeft.column(), bottomRight.column(),
                                  minMaxPair(rect.left(), rect.right()));
    const QRect updateRect(QPoint(xVals.first, yVals.first),
                           QPoint(xVals.second, yVals.second));
    return rect.intersected(updateRect);
}